

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O1

void (anonymous_namespace)::buildCommand((anonymous_namespace)::BuildContext&,llbuild::ninja::
     Command*)::NinjaCommandTask::writeDescription((anonymous_namespace)::BuildContext&,llbuild::
     ninja::Command__(BuildContext *context,Command *command)

{
  llvm lVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  char cVar6;
  char cVar7;
  uint uVar8;
  char *__format;
  uint __val;
  char *******pppppppcVar9;
  char cVar10;
  unsigned_long_long *in_R8;
  llvm *plVar11;
  llvm *plVar12;
  llvm *this;
  double dVar13;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  string s;
  char buf [64];
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  char *******local_88;
  uint local_80;
  char ******local_78 [7];
  Command *local_40;
  long local_38;
  
  local_38 = 0x70;
  if (context->verbose == false) {
    local_38 = (ulong)((command->description)._M_string_length != 0) * 0x20 + 0x70;
  }
  context->numOutputDescriptions = context->numOutputDescriptions + 1;
  plVar12 = (llvm *)(context->statusLinePrefixFormat)._M_dataplus._M_p;
  sVar2 = (context->statusLinePrefixFormat)._M_string_length;
  local_a8 = &local_98;
  local_a0 = 0;
  local_98 = 0;
  pppppppcVar9 = (char *******)(sVar2 * 4);
  std::__cxx11::string::reserve((ulong)&local_a8);
  if (sVar2 == 0) {
LAB_0012d4e7:
    anon_unknown.dwarf_b1e20::BuildContext::emitStatus
              (context,(char *)pppppppcVar9,local_a8,
               *(undefined8 *)((long)&(command->super_JobDescriptor)._vptr_JobDescriptor + local_38)
              );
    if (local_a8 != &local_98) {
      operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
    }
    if (command->executionPool ==
        ((context->manifest)._M_t.
         super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
         ._M_t.
         super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
         .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl)->consolePool) {
      llbuild::commands::CommandLineStatusOutput::finishLine(&context->statusOutput);
    }
    return;
  }
  plVar11 = plVar12 + sVar2;
LAB_0012ce7b:
  lVar1 = *plVar12;
  cVar10 = (char)&local_a8;
  if (lVar1 != (llvm)0x5c) {
    if (lVar1 != (llvm)0x25) {
      pppppppcVar9 = (char *******)(ulong)(uint)(int)(char)lVar1;
      std::__cxx11::string::push_back(cVar10);
      bVar3 = false;
      goto LAB_0012d42b;
    }
    plVar12 = plVar12 + 1;
    if (plVar12 == plVar11) {
      pppppppcVar9 = (char *******)0x25;
      std::__cxx11::string::push_back(cVar10);
      bVar3 = true;
      goto LAB_0012d42b;
    }
    lVar1 = *plVar12;
    switch(lVar1) {
    case (llvm)0x63:
    case (llvm)0x6f:
      lVar5 = std::chrono::_V2::steady_clock::now();
      dVar13 = ((double)context->numOutputDescriptions * 1000.0) /
               (double)((lVar5 - (context->buildStartTime).__d.__r) / 1000000);
      __format = "%.1f";
      goto LAB_0012d296;
    case (llvm)0x64:
    case (llvm)0x67:
    case (llvm)0x68:
    case (llvm)0x69:
    case (llvm)0x6a:
    case (llvm)0x6b:
    case (llvm)0x6c:
    case (llvm)0x6d:
    case (llvm)0x6e:
    case (llvm)0x71:
switchD_0012cebe_caseD_64:
      std::__cxx11::string::push_back(cVar10);
      pppppppcVar9 = (char *******)(ulong)(uint)(int)(char)lVar1;
      goto LAB_0012d055;
    case (llvm)0x65:
      lVar5 = std::chrono::_V2::steady_clock::now();
      dVar13 = (double)((lVar5 - (context->buildStartTime).__d.__r) / 1000000) / 1000.0;
      __format = "%.3f";
LAB_0012d296:
      pppppppcVar9 = (char *******)&local_88;
      snprintf((char *)&local_88,0x40,__format,dVar13);
      std::__cxx11::string::append((char *)&local_a8);
      goto LAB_0012d425;
    case (llvm)0x66:
      __val = context->numOutputDescriptions;
      cVar10 = '\x01';
      if (9 < __val) {
        cVar10 = '\x04';
        uVar8 = __val;
        do {
          if (uVar8 < 100) goto LAB_0012d3cd;
          if (uVar8 < 1000) goto LAB_0012d3d2;
          if (uVar8 < 10000) goto LAB_0012d3d4;
          cVar10 = cVar10 + '\x04';
          bVar3 = 99999 < uVar8;
          uVar8 = uVar8 / 10000;
        } while (bVar3);
LAB_0012d31d:
        cVar10 = cVar10 + -3;
      }
      break;
    case (llvm)0x70:
      bVar3 = false;
      pppppppcVar9 = (char *******)&local_88;
      snprintf((char *)pppppppcVar9,0x40,"%3ld%%",
               (ulong)(context->numOutputDescriptions * 100) /
               (ulong)(((context->numCommandsScanning).super___atomic_base<unsigned_int>._M_i +
                       (context->numCommandsCompleted).super___atomic_base<unsigned_int>._M_i) -
                      ((context->numCommandsUpdated).super___atomic_base<unsigned_int>._M_i +
                      (context->numCommandsUpToDate).super___atomic_base<unsigned_int>._M_i)));
      std::__cxx11::string::append((char *)&local_a8);
      goto LAB_0012d42b;
    case (llvm)0x72:
      __val = (context->numCommandsScanning).super___atomic_base<unsigned_int>._M_i;
      cVar10 = '\x01';
      if (9 < __val) {
        cVar10 = '\x04';
        uVar8 = __val;
        do {
          if (uVar8 < 100) goto LAB_0012d3cd;
          if (uVar8 < 1000) goto LAB_0012d3d2;
          if (uVar8 < 10000) goto LAB_0012d3d4;
          cVar10 = cVar10 + '\x04';
          bVar3 = 99999 < uVar8;
          uVar8 = uVar8 / 10000;
        } while (bVar3);
        goto LAB_0012d31d;
      }
      break;
    case (llvm)0x73:
      __val = (context->numCommandsScanning).super___atomic_base<unsigned_int>._M_i;
      cVar10 = '\x01';
      if (9 < __val) {
        cVar10 = '\x04';
        uVar8 = __val;
        do {
          if (uVar8 < 100) goto LAB_0012d3cd;
          if (uVar8 < 1000) goto LAB_0012d3d2;
          if (uVar8 < 10000) goto LAB_0012d3d4;
          cVar10 = cVar10 + '\x04';
          bVar3 = 99999 < uVar8;
          uVar8 = uVar8 / 10000;
        } while (bVar3);
        goto LAB_0012d31d;
      }
      break;
    case (llvm)0x74:
      __val = ((context->numCommandsScanning).super___atomic_base<unsigned_int>._M_i +
              (context->numCommandsCompleted).super___atomic_base<unsigned_int>._M_i) -
              ((context->numCommandsUpdated).super___atomic_base<unsigned_int>._M_i +
              (context->numCommandsUpToDate).super___atomic_base<unsigned_int>._M_i);
      cVar10 = '\x01';
      if (9 < __val) {
        cVar10 = '\x04';
        uVar8 = __val;
        do {
          if (uVar8 < 100) goto LAB_0012d3cd;
          if (uVar8 < 1000) goto LAB_0012d3d2;
          if (uVar8 < 10000) goto LAB_0012d3d4;
          cVar10 = cVar10 + '\x04';
          bVar3 = 99999 < uVar8;
          uVar8 = uVar8 / 10000;
        } while (bVar3);
        goto LAB_0012d31d;
      }
      break;
    case (llvm)0x75:
      __val = ((context->numCommandsScanning).super___atomic_base<unsigned_int>._M_i +
              (context->numCommandsCompleted).super___atomic_base<unsigned_int>._M_i) -
              ((context->numCommandsUpdated).super___atomic_base<unsigned_int>._M_i +
               (context->numCommandsUpToDate).super___atomic_base<unsigned_int>._M_i +
              context->numOutputDescriptions);
      cVar10 = '\x01';
      if (9 < __val) {
        cVar10 = '\x04';
        uVar8 = __val;
        do {
          if (uVar8 < 100) goto LAB_0012d3cd;
          if (uVar8 < 1000) goto LAB_0012d3d2;
          if (uVar8 < 10000) goto LAB_0012d3d4;
          cVar10 = cVar10 + '\x04';
          bVar3 = 99999 < uVar8;
          uVar8 = uVar8 / 10000;
        } while (bVar3);
        goto LAB_0012d31d;
      }
      break;
    default:
      if (lVar1 != (llvm)0x25) goto switchD_0012cebe_caseD_64;
      pppppppcVar9 = (char *******)0x25;
LAB_0012d055:
      std::__cxx11::string::push_back(cVar10);
      goto LAB_0012d425;
    }
    goto LAB_0012d3d4;
  }
  this = plVar12 + 1;
  if (this == plVar11) {
    pppppppcVar9 = (char *******)0x5c;
    std::__cxx11::string::push_back(cVar10);
    bVar3 = true;
    plVar12 = this;
    goto LAB_0012d42b;
  }
  lVar1 = *this;
  switch(lVar1) {
  case (llvm)0x5c:
    pppppppcVar9 = (char *******)0x5c;
    break;
  case (llvm)0x5d:
  case (llvm)0x5e:
  case (llvm)0x5f:
  case (llvm)0x60:
  case (llvm)0x63:
  case (llvm)0x64:
    goto switchD_0012cf55_caseD_6f;
  case (llvm)0x61:
    pppppppcVar9 = (char *******)0x7;
    break;
  case (llvm)0x62:
    pppppppcVar9 = (char *******)0x8;
    break;
  case (llvm)0x65:
    pppppppcVar9 = (char *******)0x1b;
    break;
  case (llvm)0x66:
    pppppppcVar9 = (char *******)0xc;
    break;
  default:
    switch(lVar1) {
    case (llvm)0x6e:
      pppppppcVar9 = (char *******)0xa;
      break;
    case (llvm)0x6f:
    case (llvm)0x70:
    case (llvm)0x71:
    case (llvm)0x73:
    case (llvm)0x75:
    case (llvm)0x77:
      goto switchD_0012cf55_caseD_6f;
    case (llvm)0x72:
      pppppppcVar9 = (char *******)0xd;
      break;
    case (llvm)0x74:
      pppppppcVar9 = (char *******)0x9;
      break;
    case (llvm)0x76:
      pppppppcVar9 = (char *******)0xb;
      break;
    case (llvm)0x78:
      if ((2 < (long)plVar11 - (long)this) &&
         (Str_00.Length = 0x10, Str_00.Data = (char *)0x2,
         bVar4 = llvm::getAsUnsignedInteger(plVar12 + 2,Str_00,(uint)&local_88,in_R8),
         local_88 < (char *******)0x100 && !bVar4)) {
        bVar3 = false;
        cVar6 = (char)local_88;
        if (bVar4) {
          cVar6 = '\0';
        }
        pppppppcVar9 = (char *******)(ulong)(uint)(int)cVar6;
        std::__cxx11::string::push_back(cVar10);
        plVar12 = plVar12 + 3;
        goto LAB_0012d42b;
      }
      goto switchD_0012cf55_caseD_6f;
    default:
      if (lVar1 == (llvm)0x30) {
        local_40 = command;
        if ((long)plVar11 - (long)this < 4) {
          cVar6 = '\0';
LAB_0012d44b:
          if ((2 < (long)plVar11 - (long)this) &&
             (Str_01.Length = 8, Str_01.Data = (char *)0x3,
             bVar3 = llvm::getAsUnsignedInteger(this,Str_01,(uint)&local_88,in_R8),
             local_88 < (char *******)0x100 && !bVar3)) {
            cVar7 = (char)local_88;
            if (bVar3) {
              cVar7 = cVar6;
            }
            this = plVar12 + 3;
            goto LAB_0012d4cf;
          }
          std::__cxx11::string::push_back(cVar10);
          pppppppcVar9 = (char *******)0x30;
          std::__cxx11::string::push_back(cVar10);
        }
        else {
          Str.Length = 8;
          Str.Data = (char *)0x3;
          bVar3 = llvm::getAsUnsignedInteger(plVar12 + 2,Str,(uint)&local_88,in_R8);
          pppppppcVar9 = local_88;
          if ((char *******)0xff < local_88) {
            pppppppcVar9 = (char *******)0x0;
          }
          cVar6 = (char)pppppppcVar9;
          if (bVar3) {
            cVar6 = '\0';
          }
          if ((char *******)0xff < local_88 || bVar3) goto LAB_0012d44b;
          this = plVar12 + 4;
          cVar7 = cVar6;
LAB_0012d4cf:
          pppppppcVar9 = (char *******)(ulong)(uint)(int)cVar7;
          std::__cxx11::string::push_back(cVar10);
        }
        bVar3 = false;
        plVar12 = this;
        command = local_40;
        goto LAB_0012d42b;
      }
switchD_0012cf55_caseD_6f:
      std::__cxx11::string::push_back(cVar10);
      pppppppcVar9 = (char *******)(ulong)(uint)(int)(char)lVar1;
    }
  }
  std::__cxx11::string::push_back(cVar10);
  bVar3 = false;
  plVar12 = this;
  goto LAB_0012d42b;
LAB_0012d3cd:
  cVar10 = cVar10 + -2;
  goto LAB_0012d3d4;
LAB_0012d3d2:
  cVar10 = cVar10 + -1;
LAB_0012d3d4:
  local_88 = local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_88,local_80,__val);
  pppppppcVar9 = local_88;
  std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88);
  if (local_88 != local_78) {
    pppppppcVar9 = (char *******)((long)local_78[0] + 1);
    operator_delete(local_88,(ulong)pppppppcVar9);
  }
LAB_0012d425:
  bVar3 = false;
LAB_0012d42b:
  if ((bVar3) || (plVar12 = plVar12 + 1, plVar12 == plVar11)) goto LAB_0012d4e7;
  goto LAB_0012ce7b;
}

Assistant:

static void writeDescription(BuildContext& context,
                                 ninja::Command* command) {
      const std::string& description =
        context.verbose ? command->getCommandString() :
        command->getEffectiveDescription();
      ++context.numOutputDescriptions;
      context.emitStatus("%s%s",
        context.statusLinePrefix(context.statusLinePrefixFormat).c_str(),
        description.c_str());

      // Whenever we write a description for a console job, make sure to finish
      // the output under the expectation that the console job might write to
      // the output. We don't make any attempt to lock this in case the console
      // job can run concurrently with anything else.
      if (command->getExecutionPool() == context.manifest->getConsolePool()) {
        context.statusOutput.finishLine();
      }
    }